

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

SRes crnlib::CheckErrors(CLzmaEnc *p)

{
  SRes SVar1;
  
  if (p->result != 0) {
    return p->result;
  }
  if ((p->rc).res == 0) {
    if ((p->matchFinderBase).result == 0) {
      return 0;
    }
  }
  else {
    p->result = 9;
    if ((p->matchFinderBase).result == 0) {
      SVar1 = 9;
      goto LAB_00180b29;
    }
  }
  p->result = 8;
  SVar1 = 8;
LAB_00180b29:
  p->finished = 1;
  return SVar1;
}

Assistant:

static SRes CheckErrors(CLzmaEnc* p) {
  if (p->result != SZ_OK)
    return p->result;
  if (p->rc.res != SZ_OK)
    p->result = SZ_ERROR_WRITE;
  if (p->matchFinderBase.result != SZ_OK)
    p->result = SZ_ERROR_READ;
  if (p->result != SZ_OK)
    p->finished = True;
  return p->result;
}